

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerWrite(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPVar2;
  PagerSavepoint *pPVar3;
  sqlite3_file *psVar4;
  sqlite3_vfs *psVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  DbPage *pPg_00;
  int iVar10;
  uint uVar11;
  u32 i;
  long lVar12;
  uint pgno;
  int iVar13;
  DbPage *pDStack_40;
  undefined8 uStack_38;
  
  pPVar2 = pPg->pPager;
  if (((pPg->flags & 4) != 0) &&
     (uStack_38 = (PgHdr *)(ulong)pPVar2->dbSize, pPg->pgno <= pPVar2->dbSize)) {
    if (pPVar2->nSavepoint == 0) {
      return 0;
    }
    pPVar2 = pPg->pPager;
    iVar8 = pPVar2->nSavepoint;
    if (0 < (long)iVar8) {
      uVar1 = pPg->pgno;
      pPVar3 = pPVar2->aSavepoint;
      lVar12 = 0;
      do {
        if (uVar1 <= *(uint *)((long)pPVar3->aWalData + lVar12 + -8)) {
          pDStack_40 = (DbPage *)0x13c6a0;
          iVar13 = sqlite3BitvecTestNotNull
                             (*(Bitvec **)((long)pPVar3->aWalData + lVar12 + -0x10),uVar1);
          if (iVar13 == 0) {
            iVar8 = 0;
            if (pPVar2->journalMode != '\x02') {
              psVar4 = pPVar2->sjfd;
              iVar8 = 0;
              if (psVar4->pMethods == (sqlite3_io_methods *)0x0) {
                if ((pPVar2->journalMode == '\x04') ||
                   (iVar13 = sqlite3Config.nStmtSpill, pPVar2->subjInMemory != '\0')) {
                  iVar13 = -1;
                }
                psVar5 = pPVar2->pVfs;
                psVar4[8].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[9].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[6].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[7].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[4].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[5].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[2].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[3].pMethods = (sqlite3_io_methods *)0x0;
                psVar4->pMethods = (sqlite3_io_methods *)0x0;
                psVar4[1].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[10].pMethods = (sqlite3_io_methods *)0x0;
                if (iVar13 == 0) {
                  pDStack_40 = (DbPage *)0x13c74b;
                  iVar8 = (*psVar5->xOpen)((sqlite3_file *)psVar5,0);
                }
                else {
                  iVar10 = 0x3f8;
                  if (0 < iVar13) {
                    iVar10 = iVar13;
                  }
                  *(int *)&psVar4[1].pMethods = iVar10;
                  psVar4->pMethods = &MemJournalMethods;
                  *(int *)((long)&psVar4[1].pMethods + 4) = iVar13;
                  *(undefined4 *)&psVar4[8].pMethods = 0x201e;
                  psVar4[10].pMethods = (sqlite3_io_methods *)0x0;
                  psVar4[9].pMethods = (sqlite3_io_methods *)psVar5;
                }
              }
              if (iVar8 == 0) {
                pvVar6 = pPg->pData;
                lVar12 = ((long)pPVar2->pageSize + 4) * (ulong)pPVar2->nSubRec;
                uVar1 = pPg->pgno;
                uStack_38 = (PgHdr *)CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                              (uVar1 & 0xff00) << 8 | uVar1 << 0x18,
                                              (undefined4)uStack_38);
                pDStack_40 = (DbPage *)0x13c784;
                iVar8 = (*pPVar2->sjfd->pMethods->xWrite)
                                  (pPVar2->sjfd,(void *)((long)&uStack_38 + 4),4,lVar12);
                if (iVar8 == 0) {
                  pDStack_40 = (DbPage *)0x13c7a2;
                  iVar8 = (*pPVar2->sjfd->pMethods->xWrite)
                                    (pPVar2->sjfd,pvVar6,pPVar2->pageSize,lVar12 + 4);
                }
              }
            }
            if (iVar8 != 0) {
              return iVar8;
            }
            pPVar2->nSubRec = pPVar2->nSubRec + 1;
            pDStack_40 = (DbPage *)0x13c7b9;
            iVar8 = addToSavepointBitvecs(pPVar2,pPg->pgno);
            return iVar8;
          }
        }
        lVar12 = lVar12 + 0x30;
      } while ((long)iVar8 * 0x30 != lVar12);
    }
    return 0;
  }
  if (pPVar2->errCode != 0) {
    return pPVar2->errCode;
  }
  if (pPVar2->sectorSize <= (uint)pPVar2->pageSize) {
    iVar8 = pager_write(pPg);
    return iVar8;
  }
  pPVar2 = pPg->pPager;
  uVar1 = pPVar2->dbSize;
  uVar9 = pPVar2->sectorSize / (uint)pPVar2->pageSize;
  pPVar2->doNotSpill = pPVar2->doNotSpill | 4;
  uVar11 = pPg->pgno;
  pgno = -uVar9 & uVar11 - 1;
  if (uVar1 < uVar11) {
    uVar11 = uVar11 - pgno;
  }
  else {
    uVar11 = uVar1 - pgno;
    if (pgno + uVar9 <= uVar1) {
      uVar11 = uVar9;
    }
  }
  uStack_38 = pPg;
  if ((int)uVar11 < 1) {
    iVar8 = 0;
    bVar7 = false;
  }
  else {
    bVar7 = false;
    iVar13 = 1;
    do {
      i = pgno + iVar13;
      if (((i == uStack_38->pgno) || (pPVar2->pInJournal == (Bitvec *)0x0)) ||
         (iVar8 = sqlite3BitvecTestNotNull(pPVar2->pInJournal,i), iVar8 == 0)) {
        iVar8 = 0;
        if ((i != sqlite3PendingByte / pPVar2->pageSize + 1U) &&
           (iVar8 = (*pPVar2->xGet)(pPVar2,i,&pDStack_40,0), iVar8 == 0)) {
          iVar8 = pager_write(pDStack_40);
          if ((pDStack_40->flags & 8) != 0) {
            bVar7 = true;
          }
          goto LAB_00143bdb;
        }
      }
      else {
        pDStack_40 = sqlite3PagerLookup(pPVar2,i);
        iVar8 = 0;
        if (pDStack_40 != (DbPage *)0x0) {
          iVar8 = 0;
          if ((pDStack_40->flags & 8) != 0) {
            bVar7 = true;
          }
LAB_00143bdb:
          sqlite3PagerUnrefNotNull(pDStack_40);
        }
      }
    } while ((iVar13 < (int)uVar11) && (iVar13 = iVar13 + 1, iVar8 == 0));
    bVar7 = bVar7 && iVar8 == 0;
  }
  if ((bVar7) && (0 < (int)uVar11)) {
    do {
      pgno = pgno + 1;
      pPg_00 = sqlite3PagerLookup(pPVar2,pgno);
      if (pPg_00 != (DbPage *)0x0) {
        *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
        sqlite3PagerUnrefNotNull(pPg_00);
      }
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  pPVar2->doNotSpill = pPVar2->doNotSpill & 0xfb;
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}